

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

bool Args::details::argNameLess<Args::ArgIface*>(ArgIface **a1,ArgIface **a2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*(*a1)->_vptr_ArgIface[3])(&local_60);
  if (local_60._M_string_length == 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    (*(*a2)->_vptr_ArgIface[3])(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (local_40._M_string_length != 0) {
      (*(*a1)->_vptr_ArgIface[3])(&local_60);
      if (*local_60._M_dataplus._M_p == '-') {
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        (*(*a2)->_vptr_ArgIface[3])(&local_40);
        cVar1 = *local_40._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        if (cVar1 == '-') {
          return true;
        }
      }
      (*(*a1)->_vptr_ArgIface[3])(&local_60);
      if (*local_60._M_dataplus._M_p == '-') {
        (*(*a2)->_vptr_ArgIface[3])(&local_40);
        cVar1 = *local_40._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        if (cVar1 != '-') {
          return false;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_60);
      }
      iVar3 = (*(*a1)->_vptr_ArgIface[8])();
      if ((*(long *)(CONCAT44(extraout_var,iVar3) + 8) == 0) &&
         (iVar3 = (*(*a2)->_vptr_ArgIface[8])(), *(long *)(CONCAT44(extraout_var_02,iVar3) + 8) != 0
         )) {
        return true;
      }
      iVar3 = (*(*a1)->_vptr_ArgIface[8])();
      if ((*(long *)(CONCAT44(extraout_var_00,iVar3) + 8) != 0) &&
         (iVar3 = (*(*a2)->_vptr_ArgIface[8])(), *(long *)(CONCAT44(extraout_var_01,iVar3) + 8) == 0
         )) {
        return false;
      }
      (*(*a1)->_vptr_ArgIface[3])(&local_60);
      (*(*a2)->_vptr_ArgIface[3])(&local_40);
      goto LAB_0011c68b;
    }
  }
  (*(*a1)->_vptr_ArgIface[3])(&local_60);
  (*(*a2)->_vptr_ArgIface[3])(&local_40);
LAB_0011c68b:
  bVar2 = std::operator<(&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar2;
}

Assistant:

bool argNameLess( const T & a1, const T & a2 )
{
	static const Char dash = SL( '-' );

	if( !a1->name().empty() && !a2->name().empty() )
	{
		if( *( a1->name().cbegin() ) != dash &&
				*( a2->name().cbegin() ) == dash )
			return true;
		else if( *( a1->name().cbegin() ) == dash &&
				*( a2->name().cbegin() ) != dash )
			return false;
		else if( a1->argumentName().empty() && !a2->argumentName().empty() )
			return true;
		else if( !a1->argumentName().empty() && a2->argumentName().empty() )
			return false;
		else
			return ( a1->name() < a2->name() );
	}
	else
		return ( a1->name() < a2->name() );
}